

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePop(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  uint *puVar5;
  ImU32 tree_depth_mask;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  Unindent(0.0);
  (pIVar1->DC).TreeDepth = (pIVar1->DC).TreeDepth + -1;
  uVar4 = 1 << ((byte)(pIVar1->DC).TreeDepth & 0x1f);
  if ((((pIVar2->NavMoveDir == 0) && (pIVar2->NavWindow == pIVar1)) &&
      (bVar3 = NavMoveRequestButNoResultYet(), bVar3)) &&
     (((pIVar2->NavIdIsAlive & 1U) != 0 && (((pIVar1->DC).TreeJumpToParentOnPopMask & uVar4) != 0)))
     ) {
    puVar5 = ImVector<unsigned_int>::back(&pIVar1->IDStack);
    SetNavID(*puVar5,pIVar2->NavLayer,0);
    NavMoveRequestCancel();
  }
  (pIVar1->DC).TreeJumpToParentOnPopMask = uVar4 - 1 & (pIVar1->DC).TreeJumpToParentOnPopMask;
  if ((pIVar1->IDStack).Size < 2) {
    __assert_fail("window->IDStack.Size > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                  ,0x15e1,"void ImGui::TreePop()");
  }
  PopID();
  return;
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    ImU32 tree_depth_mask = (1 << window->DC.TreeDepth);

    // Handle Left arrow to move to parent tree node (when ImGuiTreeNodeFlags_NavLeftJumpsBackHere is enabled)
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeJumpToParentOnPopMask & tree_depth_mask))
        {
            SetNavID(window->IDStack.back(), g.NavLayer, 0);
            NavMoveRequestCancel();
        }
    window->DC.TreeJumpToParentOnPopMask &= tree_depth_mask - 1;

    IM_ASSERT(window->IDStack.Size > 1); // There should always be 1 element in the IDStack (pushed during window creation). If this triggers you called TreePop/PopID too much.
    PopID();
}